

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

size_t __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy>::decode_scan
          (jls_codec<charls::lossless_traits<unsigned_char,_8>,_charls::decoder_strategy> *this,
          unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> *process_line
          ,JlsRect *rect,const_byte_span encoded_source)

{
  int32_t iVar1;
  int32_t iVar2;
  int32_t iVar3;
  uint8_t *puVar4;
  
  std::__uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_>::operator=
            ((__uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_> *)
             &(this->super_decoder_strategy).process_line_,
             (__uniq_ptr_impl<charls::process_line,_std::default_delete<charls::process_line>_> *)
             process_line);
  iVar1 = rect->Y;
  iVar2 = rect->Width;
  iVar3 = rect->Height;
  (this->rect_).X = rect->X;
  (this->rect_).Y = iVar1;
  (this->rect_).Width = iVar2;
  (this->rect_).Height = iVar3;
  decoder_strategy::initialize(&this->super_decoder_strategy,encoded_source);
  if (this->restart_interval_ == 0) {
    this->restart_interval_ = (this->super_decoder_strategy).frame_info_.height;
  }
  decode_lines(this);
  puVar4 = decoder_strategy::get_cur_byte_pos(&this->super_decoder_strategy);
  return (long)puVar4 - (long)encoded_source.data_;
}

Assistant:

size_t decode_scan(std::unique_ptr<process_line> process_line, const JlsRect& rect, const_byte_span encoded_source)
    {
        Strategy::process_line_ = std::move(process_line);

        const auto* scan_begin{encoded_source.begin()};
        rect_ = rect;

        Strategy::initialize(encoded_source);

        // Process images without a restart interval, as 1 large restart interval.
        if (restart_interval_ == 0)
        {
            restart_interval_ = frame_info().height;
        }

        decode_lines();

        return Strategy::get_cur_byte_pos() - scan_begin;
    }